

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.c
# Opt level: O2

void prvTidyParseScript(TidyDocImpl *doc,Node *script,GetTokenMode mode)

{
  Node *pNVar1;
  Node *pNVar2;
  Node **ppNVar3;
  
  doc->lexer->parent = script;
  pNVar2 = prvTidyGetToken(doc,CdataContent);
  doc->lexer->parent = (Node *)0x0;
  if (pNVar2 != (Node *)0x0) {
    pNVar2->parent = script;
    pNVar1 = script->last;
    pNVar2->prev = pNVar1;
    ppNVar3 = &pNVar1->next;
    if (pNVar1 == (Node *)0x0) {
      ppNVar3 = &script->content;
    }
    *ppNVar3 = pNVar2;
    script->last = pNVar2;
    pNVar2 = prvTidyGetToken(doc,IgnoreWhitespace);
    if (pNVar2 != (Node *)0x0) {
      if (((pNVar2->type == EndTag) && (pNVar2->tag != (Dict *)0x0)) &&
         (pNVar2->tag->id == script->tag->id)) {
        prvTidyFreeNode(doc,pNVar2);
        return;
      }
      prvTidyReport(doc,script,pNVar2,0x25a);
      prvTidyUngetToken(doc);
      return;
    }
  }
  prvTidyReport(doc,script,(Node *)0x0,0x25a);
  return;
}

Assistant:

void TY_(ParseScript)(TidyDocImpl* doc, Node *script, GetTokenMode ARG_UNUSED(mode))
{
    Node *node;
    
    doc->lexer->parent = script;
    node = TY_(GetToken)(doc, CdataContent);
    doc->lexer->parent = NULL;

    if (node)
    {
        TY_(InsertNodeAtEnd)(script, node);
    }
    else
    {
        /* handle e.g. a document like "<script>" */
        TY_(Report)(doc, script, NULL, MISSING_ENDTAG_FOR);
        return;
    }

    node = TY_(GetToken)(doc, IgnoreWhitespace);

    if (!(node && node->type == EndTag && node->tag &&
        node->tag->id == script->tag->id))
    {
        TY_(Report)(doc, script, node, MISSING_ENDTAG_FOR);

        if (node)
            TY_(UngetToken)(doc);
    }
    else
    {
        TY_(FreeNode)(doc, node);
    }
}